

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FederateExport.cpp
# Opt level: O0

HelicsBool helicsFederateIsAsyncOperationCompleted(HelicsFederate fed,HelicsError *err)

{
  bool bVar1;
  Federate *pFVar2;
  Federate *fedObj;
  HelicsError *in_stack_ffffffffffffffd8;
  HelicsFederate in_stack_ffffffffffffffe0;
  uint local_4;
  
  pFVar2 = getFed(in_stack_ffffffffffffffe0,in_stack_ffffffffffffffd8);
  if (pFVar2 == (Federate *)0x0) {
    local_4 = 0;
  }
  else {
    bVar1 = helics::Federate::isAsyncOperationCompleted((Federate *)fed);
    local_4 = (uint)bVar1;
  }
  return local_4;
}

Assistant:

HelicsBool helicsFederateIsAsyncOperationCompleted(HelicsFederate fed, HelicsError* err)
{
    auto* fedObj = getFed(fed, err);
    if (fedObj == nullptr) {
        return HELICS_FALSE;
    }
    try {
        return (fedObj->isAsyncOperationCompleted()) ? HELICS_TRUE : HELICS_FALSE;
    }
    catch (...) {
        helicsErrorHandler(err);
        return HELICS_FALSE;
    }
}